

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void TestFixAllocator(void)

{
  bool bVar1;
  People *pPVar2;
  People *ptr;
  char *pcVar3;
  char *old_area;
  People *p2;
  People *p1;
  FixedAllocator<People> allocator;
  
  printf("===================== TestFixAllocator BEGIN ===================\n");
  tcmalloc::FixedAllocator<People>::FixedAllocator((FixedAllocator<People> *)&p1);
  pPVar2 = tcmalloc::FixedAllocator<People>::Alloc((FixedAllocator<People> *)&p1);
  ptr = tcmalloc::FixedAllocator<People>::Alloc((FixedAllocator<People> *)&p1);
  if (pPVar2 == (People *)0x0) {
    __assert_fail("p1 != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/example/test/main.cpp"
                  ,0x1b,"void TestFixAllocator()");
  }
  if (ptr == (People *)0x0) {
    __assert_fail("p2 != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/example/test/main.cpp"
                  ,0x1c,"void TestFixAllocator()");
  }
  pcVar3 = tcmalloc::FixedAllocator<People>::Area((FixedAllocator<People> *)&p1);
  if (pcVar3 == (char *)0x0) {
    __assert_fail("old_area != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/example/test/main.cpp"
                  ,0x1e,"void TestFixAllocator()");
  }
  TestFixAllocator::People::People(pPVar2,0x12);
  bVar1 = tcmalloc::FixedAllocator<People>::FreeListEmpty((FixedAllocator<People> *)&p1);
  if (!bVar1) {
    __assert_fail("allocator.FreeListEmpty()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/example/test/main.cpp"
                  ,0x23,"void TestFixAllocator()");
  }
  tcmalloc::FixedAllocator<People>::Free((FixedAllocator<People> *)&p1,pPVar2);
  bVar1 = tcmalloc::FixedAllocator<People>::FreeListEmpty((FixedAllocator<People> *)&p1);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("!allocator.FreeListEmpty()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/example/test/main.cpp"
                  ,0x25,"void TestFixAllocator()");
  }
  tcmalloc::FixedAllocator<People>::Free((FixedAllocator<People> *)&p1,ptr);
  bVar1 = tcmalloc::FixedAllocator<People>::FreeListEmpty((FixedAllocator<People> *)&p1);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("!allocator.FreeListEmpty()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/example/test/main.cpp"
                  ,0x27,"void TestFixAllocator()");
  }
  pPVar2 = tcmalloc::FixedAllocator<People>::Alloc((FixedAllocator<People> *)&p1);
  if (pPVar2 == (People *)0x0) {
    __assert_fail("allocator.Alloc() != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/example/test/main.cpp"
                  ,0x29,"void TestFixAllocator()");
  }
  bVar1 = tcmalloc::FixedAllocator<People>::FreeListEmpty((FixedAllocator<People> *)&p1);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("!allocator.FreeListEmpty()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/example/test/main.cpp"
                  ,0x2a,"void TestFixAllocator()");
  }
  pPVar2 = tcmalloc::FixedAllocator<People>::Alloc((FixedAllocator<People> *)&p1);
  if (pPVar2 == (People *)0x0) {
    __assert_fail("allocator.Alloc() != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/example/test/main.cpp"
                  ,0x2b,"void TestFixAllocator()");
  }
  bVar1 = tcmalloc::FixedAllocator<People>::FreeListEmpty((FixedAllocator<People> *)&p1);
  if (!bVar1) {
    __assert_fail("allocator.FreeListEmpty()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/example/test/main.cpp"
                  ,0x2c,"void TestFixAllocator()");
  }
  pcVar3 = tcmalloc::FixedAllocator<People>::Area((FixedAllocator<People> *)&p1);
  if (pcVar3 != (char *)0x0) {
    printf("===================== TestFixAllocator PASS =====================\n");
    return;
  }
  __assert_fail("old_area = allocator.Area()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/example/test/main.cpp"
                ,0x2d,"void TestFixAllocator()");
}

Assistant:

void TestFixAllocator() {
    printf("===================== TestFixAllocator BEGIN ===================\n");
    struct People {
        People(int age) : age_(age) {}
        int     age_;
        int     padding;
    };

    tcmalloc::FixedAllocator<People> allocator;
    People* p1 = allocator.Alloc();
    People* p2 = allocator.Alloc();
    assert(p1 != nullptr);
    assert(p2 != nullptr);
    char *old_area = allocator.Area();
    assert(old_area != nullptr);

    p1 = new (p1) People(18);
    p1->~People();

    assert(allocator.FreeListEmpty());
    allocator.Free(p1);
    assert(!allocator.FreeListEmpty());
    allocator.Free(p2);
    assert(!allocator.FreeListEmpty());

    assert(allocator.Alloc() != nullptr);
    assert(!allocator.FreeListEmpty());
    assert(allocator.Alloc() != nullptr);
    assert(allocator.FreeListEmpty());
    assert(old_area = allocator.Area());

    printf("===================== TestFixAllocator PASS =====================\n");
}